

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_IsCoinBase_Test::TestBody(AbstractTransaction_IsCoinBase_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  Message local_40 [3];
  byte local_21;
  undefined1 local_20 [7];
  bool is_coinbase;
  TestTransaction tx;
  AbstractTransaction_IsCoinBase_Test *this_local;
  
  tx.super_AbstractTransaction.wally_tx_pointer_ = this;
  TestTransaction::TestTransaction((TestTransaction *)local_20);
  local_21 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_21 = cfd::core::AbstractTransaction::IsCoinBase((AbstractTransaction *)local_20);
    }
  }
  else {
    testing::Message::Message(local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x14b,
               "Expected: (is_coinbase = tx.IsCoinBase()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_40);
  }
  local_59 = (bool)(~local_21 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_59,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_58,(AssertionResult *)"is_coinbase","true","false",in_R9)
    ;
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x14c,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  TestTransaction::~TestTransaction((TestTransaction *)local_20);
  return;
}

Assistant:

TEST(AbstractTransaction, IsCoinBase) {
  TestTransaction tx;
  bool is_coinbase = false;
  EXPECT_NO_THROW((is_coinbase = tx.IsCoinBase()));
  EXPECT_FALSE(is_coinbase);
}